

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

size_t http_sprintf_headers(char *buf,size_t sz,nni_list *list)

{
  int iVar1;
  nni_list *pnVar2;
  nni_list *local_40;
  size_t l;
  http_header *h;
  size_t rv;
  nni_list *list_local;
  size_t sz_local;
  char *buf_local;
  
  h = (http_header *)0x0;
  list_local = (nni_list *)sz;
  if (buf == (char *)0x0) {
    list_local = (nni_list *)0x0;
  }
  l = (size_t)nni_list_first(list);
  sz_local = (size_t)buf;
  for (; l != 0; l = (size_t)nni_list_next(list,(void *)l)) {
    iVar1 = snprintf((char *)sz_local,(size_t)list_local,"%s: %s\r\n",*(undefined8 *)l,
                     *(undefined8 *)(l + 8));
    pnVar2 = (nni_list *)(long)iVar1;
    if (sz_local != 0) {
      sz_local = (long)&(pnVar2->ll_head).ln_next + sz_local;
    }
    if (pnVar2 < list_local) {
      local_40 = (nni_list *)((long)list_local - (long)pnVar2);
    }
    else {
      local_40 = (nni_list *)0x0;
    }
    list_local = local_40;
    h = (http_header *)((long)&h->name + (long)&pnVar2->ll_head);
  }
  return (size_t)h;
}

Assistant:

static size_t
http_sprintf_headers(char *buf, size_t sz, nni_list *list)
{
	size_t       rv = 0;
	http_header *h;

	if (buf == NULL) {
		sz = 0;
	}

	NNI_LIST_FOREACH (list, h) {
		size_t l;
		l = snprintf(buf, sz, "%s: %s\r\n", h->name, h->value);
		if (buf != NULL) {
			buf += l;
		}
		sz = (sz > l) ? sz - l : 0;
		rv += l;
	}
	return (rv);
}